

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_close_with_valid_status_codes(void)

{
  cio_error cVar1;
  undefined1 local_58 [4];
  cio_error err;
  ws_frame frames [1];
  uint16_t *data;
  undefined8 uStack_28;
  uint i;
  uint16_t close_codes [11];
  
  uStack_28 = 0x3eb03ea03e903e8;
  close_codes[0] = 0x3ef;
  close_codes[1] = 0x3f0;
  close_codes[2] = 0x3f1;
  close_codes[3] = 0x3f2;
  close_codes[4] = 0x3f3;
  close_codes[5] = 3000;
  close_codes[6] = 4999;
  data._4_4_ = 0;
  while( true ) {
    if (10 < data._4_4_) {
      return;
    }
    frames[0]._0_8_ = (long)&stack0xffffffffffffffd8 + (ulong)data._4_4_ * 2;
    local_58 = (undefined1  [4])0x8;
    err = CIO_SUCCESS;
    frames[0].data = (void *)0x2;
    frames[0].data_length._0_1_ = 1;
    frames[0].data_length._1_1_ = 0;
    frames[0]._24_8_ = frames[0]._0_8_;
    serialize_frames((ws_frame *)local_58,1);
    *(ushort *)&(ws->ws_private).ws_flags =
         *(ushort *)&(ws->ws_private).ws_flags & 0xfbff | (ushort)(err == CIO_SUCCESS) << 10;
    cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Could not start reading a message!",0x8bf,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x8c1,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
               "websocket parameter of read_handler not correct",0x8c2,UNITY_DISPLAY_STYLE_INT);
    if (read_handler_fake.arg1_val != (void *)0x0) break;
    UnityAssertEqualNumber
              (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not CIO_SUCCESS",
               0x8c4,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_error_fake.call_count,"error callback was not called",0x8c6,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_control_fake.call_count,
               "control callback was called for last close frame",0x8c8,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_control_fake.arg0_val,
               "websocket parameter of on_control handler not correct",0x8c9,UNITY_DISPLAY_STYLE_INT
              );
    UnityAssertEqualNumber
              (8,(ulong)on_control_fake.arg1_val,
               "frame type parameter of on_control handler not correct",0x8ca,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (2,(ulong)on_control_fake.arg3_val,
               "data length parameter of on_control handler not correct",0x8cb,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualMemory
              ((void *)frames[0]._24_8_,read_back_buffer,2,1,
               "echoed data in close frame not correct",0x8cd,UNITY_ARRAY_TO_ARRAY);
    free(ws);
    setUp();
    data._4_4_ = data._4_4_ + 1;
  }
  UnityFail("context of read handler not NULL",0x8c3);
}

Assistant:

static void test_close_with_valid_status_codes(void)
{

	uint16_t close_codes[] = {
	    CIO_WEBSOCKET_CLOSE_NORMAL,
	    CIO_WEBSOCKET_CLOSE_GOING_AWAY,
	    CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR,
	    CIO_WEBSOCKET_CLOSE_UNSUPPORTED,
	    CIO_WEBSOCKET_CLOSE_UNSUPPORTED_DATA,
	    CIO_WEBSOCKET_CLOSE_POLICY_VIOLATION,
	    CIO_WEBSOCKET_CLOSE_TOO_LARGE,
	    CIO_WEBSOCKET_CLOSE_MISSING_EXTENSION,
	    CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
	    CIO_WEBSOCKET_CLOSE_RESERVED_LOWER_BOUND,
	    CIO_WEBSOCKET_CLOSE_RESERVED_UPPER_BOUND};

	for (unsigned int i = 0; i < ARRAY_SIZE(close_codes); i++) {
		uint16_t *data = &close_codes[i];
		struct ws_frame frames[] = {
		    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = 2, .last_frame = true, .rsv = false},
		};

		serialize_frames(frames, ARRAY_SIZE(frames));

		ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
		enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

		TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
		TEST_ASSERT_EQUAL_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
		TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context of read handler not NULL");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not CIO_SUCCESS");

		TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was not called");

		TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was called for last close frame");
		TEST_ASSERT_EQUAL_MESSAGE(ws, on_control_fake.arg0_val, "websocket parameter of on_control handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_CLOSE_FRAME, on_control_fake.arg1_val, "frame type parameter of on_control handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(2, on_control_fake.arg3_val, "data length parameter of on_control handler not correct");

		TEST_ASSERT_EQUAL_MEMORY_MESSAGE(data, read_back_buffer, 2, "echoed data in close frame not correct");

		free(ws);
		setUp();
	}
}